

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ArrayPtr<const_kj::CidrRange> kj::_::localCidrs(void)

{
  int iVar1;
  ArrayPtr<const_kj::CidrRange> AVar2;
  StringPtr pattern;
  StringPtr pattern_00;
  StringPtr pattern_01;
  StringPtr pattern_02;
  
  if (localCidrs()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&localCidrs()::result);
    if (iVar1 != 0) {
      pattern.content.size_ = 0xc;
      pattern.content.ptr = "127.0.0.0/8";
      CidrRange::CidrRange((CidrRange *)localCidrs()::result,pattern);
      pattern_00.content.size_ = 8;
      pattern_00.content.ptr = "::1/128";
      CidrRange::CidrRange((CidrRange *)(localCidrs()::result + 0x18),pattern_00);
      pattern_01.content.size_ = 0xb;
      pattern_01.content.ptr = "0.0.0.0/32";
      CidrRange::CidrRange((CidrRange *)(localCidrs()::result + 0x30),pattern_01);
      pattern_02.content.size_ = 7;
      pattern_02.content.ptr = "::/128";
      CidrRange::CidrRange((CidrRange *)(localCidrs()::result + 0x48),pattern_02);
      __cxa_guard_release(&localCidrs()::result);
    }
  }
  AVar2.size_ = 4;
  AVar2.ptr = (CidrRange *)localCidrs()::result;
  return AVar2;
}

Assistant:

ArrayPtr<const CidrRange> localCidrs() {
  static const CidrRange result[] = {
    // localhost
    "127.0.0.0/8"_kj,
    "::1/128"_kj,

    // Trying to *connect* to 0.0.0.0 on many systems is equivalent to connecting to localhost.
    // (wat)
    "0.0.0.0/32"_kj,
    "::/128"_kj,
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}